

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::Demangle(char *mangled,char *out,int out_size)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  State state;
  State local_38;
  
  local_38.out_end = out + out_size;
  local_38.prev_name = (char *)0x0;
  local_38.prev_name_length = -1;
  local_38.nest_level = -1;
  local_38.append = true;
  local_38.overflowed = false;
  local_38.mangled_cur = mangled;
  local_38.out_cur = out;
  local_38.out_begin = out;
  bVar3 = ParseMangledName(&local_38);
  if (bVar3) {
    cVar1 = *local_38.mangled_cur;
    bVar6 = 1;
    if (cVar1 == '\0') goto LAB_00122b16;
    lVar4 = 0;
    cVar5 = cVar1;
    while (cVar5 == '.') {
      if (0x19 < (byte)((local_38.mangled_cur[lVar4 + 1] & 0xdfU) + 0xbf)) goto LAB_00122b06;
      lVar2 = lVar4 + 3;
      do {
        lVar4 = lVar2;
        lVar2 = lVar4 + 1;
      } while ((byte)((local_38.mangled_cur[lVar4 + -1] & 0xdfU) + 0xbf) < 0x1a);
      if ((local_38.mangled_cur[lVar4 + -1] != 0x2e) ||
         (9 < (byte)(local_38.mangled_cur[lVar4] - 0x30U))) goto LAB_00122b06;
      do {
        cVar5 = local_38.mangled_cur[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while ((byte)(cVar5 - 0x30U) < 10);
    }
    if (cVar5 == '\0') goto LAB_00122b16;
LAB_00122b06:
    if (cVar1 == '@') {
      MaybeAppend(&local_38,local_38.mangled_cur);
      goto LAB_00122b16;
    }
  }
  bVar6 = 0;
LAB_00122b16:
  return (bool)((local_38.overflowed ^ 1U) & bVar6);
}

Assistant:

bool Demangle(const char *mangled, char *out, int out_size) {
#if defined(OS_WINDOWS)
  // When built with incremental linking, the Windows debugger
  // library provides a more complicated `Symbol->Name` with the
  // Incremental Linking Table offset, which looks like
  // `@ILT+1105(?func@Foo@@SAXH@Z)`. However, the demangler expects
  // only the mangled symbol, `?func@Foo@@SAXH@Z`. Fortunately, the
  // mangled symbol is guaranteed not to have parentheses,
  // so we search for `(` and extract up to `)`.
  //
  // Since we may be in a signal handler here, we cannot use `std::string`.
  char buffer[1024];  // Big enough for a sane symbol.
  const char *lparen = strchr(mangled, '(');
  if (lparen) {
    // Extract the string `(?...)`
    const char *rparen = strchr(lparen, ')');
    size_t length = rparen - lparen - 1;
    strncpy(buffer, lparen + 1, length);
    buffer[length] = '\0';
    mangled = buffer;
  } // Else the symbol wasn't inside a set of parentheses
  // We use the ANSI version to ensure the string type is always `char *`.
  return UnDecorateSymbolName(mangled, out, out_size, UNDNAME_COMPLETE);
#else
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !state.overflowed;
#endif
}